

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall
stringToUnits_tempString_Test::~stringToUnits_tempString_Test(stringToUnits_tempString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringToUnits, tempString)
{
    auto u4 = unit_from_string("calorie (20 degC)");
    EXPECT_EQ(u4, precise::energy::cal_20);

    u4 = unit_from_string("calorie 20C");
    EXPECT_EQ(u4, precise::energy::cal_20);

    u4 = unit_from_string("calorie at 20C");
    EXPECT_EQ(u4, precise::energy::cal_20);

    u4 = unit_from_string("calorie_20C");
    EXPECT_EQ(u4, precise::energy::cal_20);
}